

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O1

PAL_ERROR CorUnix::CPalSynchronizationManager::ThreadNativeWait
                    (ThreadNativeWaitData *ptnwdNativeWaitData,DWORD dwTimeout,
                    ThreadWakeupReason *ptwrWakeupReason,DWORD *pdwSignaledObject)

{
  PAL_ERROR PVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  undefined1 local_50 [8];
  timespec tsAbsTmo;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_003474fd;
  tsAbsTmo.tv_nsec = (__syscall_slong_t)pdwSignaledObject;
  if (dwTimeout == 0xffffffff) {
    PVar1 = 0;
LAB_003473a9:
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)ptnwdNativeWaitData);
    if (iVar2 == 0) {
      do {
        if (ptnwdNativeWaitData->iPred != 0) {
          iVar2 = 0;
          goto LAB_00347492;
        }
        if (dwTimeout == 0xffffffff) {
          iVar2 = pthread_cond_wait((pthread_cond_t *)&ptnwdNativeWaitData->cond,
                                    (pthread_mutex_t *)ptnwdNativeWaitData);
        }
        else {
          iVar2 = pthread_cond_timedwait
                            ((pthread_cond_t *)&ptnwdNativeWaitData->cond,
                             (pthread_mutex_t *)ptnwdNativeWaitData,(timespec *)local_50);
        }
      } while (iVar2 == 0);
      if (iVar2 == 0x6e) {
        iVar2 = 0x6e;
        if (dwTimeout == 0xffffffff) {
          fprintf(_stderr,"] %s %s:%d","ThreadNativeWait",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                  ,0x1d2);
          fprintf(_stderr,
                  "Expression: INFINITE != dwTimeout, Description: Got a ETIMEDOUT despite timeout was INFINITE\n"
                 );
        }
      }
      else {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_003474fd;
        piVar4 = __errno_location();
        strerror(*piVar4);
        PVar1 = 0x54f;
      }
LAB_00347492:
      if (iVar2 == 0) {
        ptnwdNativeWaitData->iPred = 0;
      }
      iVar3 = pthread_mutex_unlock((pthread_mutex_t *)ptnwdNativeWaitData);
      if (iVar3 != 0) {
        PVar1 = 0x54f;
        goto LAB_003474b2;
      }
      if (iVar2 == 0) {
        *ptwrWakeupReason = ptnwdNativeWaitData->twrWakeupReason;
        *(DWORD *)tsAbsTmo.tv_nsec = ptnwdNativeWaitData->dwObjectIndex;
      }
      else if (iVar2 == 0x6e) {
        *ptwrWakeupReason = WaitTimeout;
      }
    }
    else {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_003474fd;
      *ptwrWakeupReason = WaitFailed;
      PVar1 = 0x54f;
    }
  }
  else {
    PVar1 = GetAbsoluteTimeout(dwTimeout,(timespec *)local_50);
    if (PVar1 == 0) goto LAB_003473a9;
LAB_003474b2:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_003474fd;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar1;
  }
LAB_003474fd:
  abort();
}

Assistant:

PAL_ERROR CPalSynchronizationManager::ThreadNativeWait(
        ThreadNativeWaitData * ptnwdNativeWaitData,
        DWORD dwTimeout,
        ThreadWakeupReason * ptwrWakeupReason,
        DWORD * pdwSignaledObject)
    {
        PAL_ERROR palErr = NO_ERROR;
        int iRet, iWaitRet = 0;
        struct timespec tsAbsTmo;

        TRACE("ThreadNativeWait(ptnwdNativeWaitData=%p, dwTimeout=%u, ...)\n",
              ptnwdNativeWaitData, dwTimeout);

        if (dwTimeout != INFINITE)
        {
            // Calculate absolute timeout
            palErr = GetAbsoluteTimeout(dwTimeout, &tsAbsTmo);
            if (NO_ERROR != palErr)
            {
                ERROR("Failed to convert timeout to absolute timeout\n");
                goto TNW_exit;
            }
        }

        // Lock the mutex
        iRet = pthread_mutex_lock(&ptnwdNativeWaitData->mutex);
        if (0 != iRet)
        {
            ERROR("Internal Error: cannot lock mutex\n");
            palErr = ERROR_INTERNAL_ERROR;
            *ptwrWakeupReason = WaitFailed;
            goto TNW_exit;
        }

        while (FALSE == ptnwdNativeWaitData->iPred)
        {
            if (INFINITE == dwTimeout)
            {
                iWaitRet = pthread_cond_wait(&ptnwdNativeWaitData->cond,
                                             &ptnwdNativeWaitData->mutex);
            }
            else
            {
                iWaitRet = pthread_cond_timedwait(&ptnwdNativeWaitData->cond,
                                                  &ptnwdNativeWaitData->mutex,
                                                  &tsAbsTmo);
            }

            if (ETIMEDOUT == iWaitRet)
            {
                _ASSERT_MSG(INFINITE != dwTimeout,
                            "Got a ETIMEDOUT despite timeout was INFINITE\n");
                break;
            }
            else if (0 != iWaitRet)
            {
                ERROR("pthread_cond_%swait returned %d [errno=%d (%s)]\n",
                       (INFINITE == dwTimeout) ? "" : "timed",
                       iWaitRet, errno, strerror(errno));
                palErr = ERROR_INTERNAL_ERROR;
                break;
            }
        }

        // Reset the predicate
        if (0 == iWaitRet)
        {
            // We don't want to reset the predicate if pthread_cond_timedwait
            // timed out racing with a pthread_cond_signal. When
            // pthread_cond_timedwait times out, it needs to grab the mutex
            // before returning. At timeout time, it may happen that the
            // signaling thread just grabbed the mutex, but it hasn't called
            // pthread_cond_signal yet. In this scenario pthread_cond_timedwait
            // will have to wait for the signaling side to release the mutex.
            // As result it will return with error timeout, but the predicate
            // will be set. Since pthread_cond_timedwait timed out, the
            // predicate value is intended for the next signal. In case of a
            // object signaling racing with a wait timeout this predicate value
            // will be picked up by the 'second native wait' (see comments in
            // BlockThread).

            ptnwdNativeWaitData->iPred = FALSE;
        }

        // Unlock the mutex
        iRet = pthread_mutex_unlock(&ptnwdNativeWaitData->mutex);
        if (0 != iRet)
        {
            ERROR("Cannot unlock mutex [err=%d]\n", iRet);
            palErr = ERROR_INTERNAL_ERROR;
            goto TNW_exit;
        }

        _ASSERT_MSG(ETIMEDOUT != iRet || INFINITE != dwTimeout,
                    "Got time out return code with INFINITE timeout\n");

        if (0 == iWaitRet)
        {
            *ptwrWakeupReason  = ptnwdNativeWaitData->twrWakeupReason;
            *pdwSignaledObject = ptnwdNativeWaitData->dwObjectIndex;
        }
        else if (ETIMEDOUT == iWaitRet)
        {
            *ptwrWakeupReason = WaitTimeout;
        }

    TNW_exit:

        TRACE("ThreadNativeWait: returning %u [WakeupReason=%u]\n",
              palErr, *ptwrWakeupReason);

        return palErr;
    }